

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_FCADD(DisasContext_conflict1 *s,arg_FCADD *a)

{
  int iVar1;
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_ptr ptr;
  uintptr_t o;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      oprsz = s->sve_len;
      ptr = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
      tcg_gen_gvec_4_ptr_aarch64
                (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->rm * 0x100 + 0xc10,
                 a->pg * 0x20 + 0x2c10,ptr,oprsz,oprsz,a->rot,
                 *(undefined1 **)(trans_FACGT_ppzz_fns + (long)a->esz * 8 + 0x18));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_FCADD(DisasContext *s, arg_FCADD *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_4_ptr * const fns[3] = {
        gen_helper_sve_fcadd_h,
        gen_helper_sve_fcadd_s,
        gen_helper_sve_fcadd_d
    };

    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
        tcg_gen_gvec_4_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           pred_full_reg_offset(s, a->pg),
                           status, vsz, vsz, a->rot, fns[a->esz - 1]);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}